

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# editing_commands.cpp
# Opt level: O0

void save_as_do_proc(Am_Object *command_obj)

{
  bool bVar1;
  Am_Object local_40;
  undefined4 local_38;
  Am_String local_28;
  Am_String local_20;
  Am_String filename;
  Am_String default_file_name;
  Am_Object *command_obj_local;
  
  get_default_filename((Am_Object *)&filename);
  Am_String::Am_String(&local_28,&filename);
  Am_Show_File_Dialog_For_Save(&local_20);
  Am_String::~Am_String(&local_28);
  bVar1 = Am_String::Valid(&local_20);
  if ((!bVar1) || (bVar1 = Am_String::operator==(&local_20,""), bVar1)) {
    local_38 = 1;
  }
  else {
    Am_Object::Am_Object(&local_40,command_obj);
    internal_do_save(&local_40,&local_20);
    Am_Object::~Am_Object(&local_40);
    local_38 = 0;
  }
  Am_String::~Am_String(&local_20);
  Am_String::~Am_String(&filename);
  return;
}

Assistant:

Am_Define_Method(Am_Object_Method, void, save_as_do, (Am_Object command_obj))
{
  Am_String default_file_name = get_default_filename(command_obj);
  Am_String filename = Am_Show_File_Dialog_For_Save(default_file_name);
  if (!filename.Valid() || filename == "")
    return;
  internal_do_save(command_obj, filename);
}